

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  bool bVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  long local_40;
  long local_38;
  
  if (text->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    pbVar2 = (byte *)std::__cxx11::string::at((ulong)text);
    if ((*pbVar2 == 0x5f) || ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a)) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)text);
      lVar3 = 0;
      do {
        bVar4 = local_38 == lVar3;
        if (bVar4) break;
        bVar1 = anon_unknown_0::Alphanumeric::InClass(*(char *)(local_40 + lVar3));
        lVar3 = lVar3 + 1;
      } while (bVar1);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return bVar4;
}

Assistant:

bool Tokenizer::TryParseFloat(const std::string& text, double* result) {
  const char* start = text.c_str();
  char* end;
  *result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  return static_cast<size_t>(end - start) == text.size() && *start != '-';
}